

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>::
ExplainMatchResultTo
          (TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)> *this,
          ArgumentTuple *args,ostream *os)

{
  MatcherInterface<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&> *pMVar1;
  bool bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  ExpectationSet unsatisfied_prereqs;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [8];
  _Base_ptr local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if ((this->super_ExpectationBase).retired_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: the expectation is active\n",0x2d);
    pcVar7 = "           Actual: it is retired\n";
    lVar5 = 0x21;
LAB_001532af:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar5);
    return;
  }
  bVar2 = Matches(this,args);
  if (bVar2) {
    bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar2) {
      pcVar7 = "The call matches the expectation.\n";
      lVar5 = 0x22;
      goto LAB_001532af;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: all pre-requisites are satisfied\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"           Actual: the following immediate pre-requisites ",0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(os,"are not satisfied:\n",0x13);
    local_1c0 = (undefined1  [8])((ulong)(uint)local_1c0._4_4_ << 0x20);
    local_1b8 = (_Base_ptr)0x0;
    local_1a0 = 0;
    local_1b0 = (_Rb_tree_node_base *)local_1c0;
    local_1a8 = (_Rb_tree_node_base *)local_1c0;
    ExpectationBase::FindUnsatisfiedPrerequisites
              (&this->super_ExpectationBase,(ExpectationSet *)local_1c8);
    if (local_1b0 != (_Rb_tree_node_base *)local_1c0) {
      iVar6 = 0;
      p_Var4 = local_1b0;
      do {
        ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var4 + 1),os);
        std::__ostream_insert<char,std::char_traits<char>>(os,"pre-requisite #",0xf);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        iVar6 = iVar6 + 1;
      } while (p_Var4 != (_Rb_tree_node_base *)local_1c0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"                   (end of pre-requisites)\n",0x2b);
    std::
    _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
    ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                 *)local_1c8);
  }
  else {
    bVar2 = TuplePrefix<2ul>::
            Matches<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
                      (&this->matchers_,args);
    if (!bVar2) {
      TuplePrefix<2ul>::
      ExplainMatchFailuresTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
                (&this->matchers_,args,os);
    }
    local_1c0 = (undefined1  [8])&local_1a8;
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00288348;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    pMVar1 = (this->extra_matcher_).
             super_MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>
             .impl_.value_;
    iVar6 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,args,local_1c8);
    if ((char)iVar6 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"    Expected args: ",0x13);
      pMVar1 = (this->extra_matcher_).
               super_MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>
               .impl_.value_;
      (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"\n           Actual: don\'t match",0x1f);
      std::__cxx11::stringbuf::str();
      iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
      if ((os != (ostream *)0x0) && (iVar6 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e8,local_1e0);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    }
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00288348;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }